

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O0

void __thiscall glu::ES2ContextInfo::ES2ContextInfo(ES2ContextInfo *this,RenderContext *context)

{
  bool local_91;
  TryCompileProgram local_90;
  bool local_79;
  TryCompileProgram local_78;
  bool local_61;
  TryCompileProgram local_60;
  bool local_49;
  TryCompileProgram local_48;
  bool local_35 [13];
  TryCompileProgram local_28;
  RenderContext *local_18;
  RenderContext *context_local;
  ES2ContextInfo *this_local;
  
  local_18 = context;
  context_local = (RenderContext *)this;
  ContextInfo::ContextInfo(&this->super_ContextInfo,context);
  (this->super_ContextInfo)._vptr_ContextInfo = (_func_int **)&PTR__ES2ContextInfo_004049c0;
  TryCompileProgram::TryCompileProgram
            (&local_28,s_vertexUniformLoopsSupported,s_defaultFragmentShader);
  local_35[0] = false;
  CachedValue<bool,_glu::TryCompileProgram>::CachedValue
            (&this->m_vertexUniformLoopsSupported,local_28,local_35);
  TryCompileProgram::TryCompileProgram
            (&local_48,s_vertexDynamicLoopsSupported,s_defaultFragmentShader);
  local_49 = false;
  CachedValue<bool,_glu::TryCompileProgram>::CachedValue
            (&this->m_vertexDynamicLoopsSupported,local_48,&local_49);
  TryCompileProgram::TryCompileProgram
            (&local_60,s_defaultVertexShader,s_fragmentHighPrecisionSupported);
  local_61 = false;
  CachedValue<bool,_glu::TryCompileProgram>::CachedValue
            (&this->m_fragmentHighPrecisionSupported,local_60,&local_61);
  TryCompileProgram::TryCompileProgram
            (&local_78,s_defaultVertexShader,s_fragmentUniformLoopsSupported);
  local_79 = false;
  CachedValue<bool,_glu::TryCompileProgram>::CachedValue
            (&this->m_fragmentUniformLoopsSupported,local_78,&local_79);
  TryCompileProgram::TryCompileProgram
            (&local_90,s_defaultVertexShader,s_fragmentDynamicLoopsSupported);
  local_91 = false;
  CachedValue<bool,_glu::TryCompileProgram>::CachedValue
            (&this->m_fragmentDynamicLoopsSupported,local_90,&local_91);
  return;
}

Assistant:

ES2ContextInfo::ES2ContextInfo (const RenderContext& context)
	: glu::ContextInfo					(context)
	, m_vertexUniformLoopsSupported		(TryCompileProgram(s_vertexUniformLoopsSupported, s_defaultFragmentShader))
	, m_vertexDynamicLoopsSupported		(TryCompileProgram(s_vertexDynamicLoopsSupported, s_defaultFragmentShader))
	, m_fragmentHighPrecisionSupported	(TryCompileProgram(s_defaultVertexShader, s_fragmentHighPrecisionSupported))
	, m_fragmentUniformLoopsSupported	(TryCompileProgram(s_defaultVertexShader, s_fragmentUniformLoopsSupported))
	, m_fragmentDynamicLoopsSupported	(TryCompileProgram(s_defaultVertexShader, s_fragmentDynamicLoopsSupported))
{
}